

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O2

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createStringModel(tst_SerialiserCommon *this,QObject *parent)

{
  result_type_conflict rVar1;
  result_type_conflict rVar2;
  QStringListModel *this_00;
  QStringList itmesList;
  uniform_int_distribution<int> itemsDist;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  uniform_int_distribution<int> rowsDist;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  rowsDist._M_param._M_a = 0x14;
  rowsDist._M_param._M_b = 0x32;
  itemsDist._M_param._M_a = 0;
  itemsDist._M_param._M_b = 1000;
  itmesList.d.d = (Data *)0x0;
  itmesList.d.ptr = (QString *)0x0;
  itmesList.d.size = 0;
  rVar1 = std::uniform_int_distribution<int>::operator()(&rowsDist,&this->generator);
  for (; 0 < rVar1; rVar1 = rVar1 + -1) {
    local_a0.d = (Data *)0x0;
    local_a0.ptr = L"Item ";
    local_a0.size = 5;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    rVar2 = std::uniform_int_distribution<int>::operator()(&itemsDist,&this->generator);
    QString::number((int)&local_60,rVar2);
    operator+((QString *)&local_48,(QString *)&local_a0,(QString *)&local_60);
    QList<QString>::emplaceBack<QString_const&>(&itmesList,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,(QList *)&itmesList,parent);
  QArrayDataPointer<QString>::~QArrayDataPointer(&itmesList.d);
  return (QAbstractItemModel *)this_00;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createStringModel(QObject *parent)
{
    std::uniform_int_distribution<int> rowsDist(20, 50);
    std::uniform_int_distribution<int> itemsDist(0, 1000);

    QStringList itmesList;
    for (int i = rowsDist(generator); i > 0; --i)
        itmesList.append(QStringLiteral("Item ") + QString::number(itemsDist(generator)));
    return new QStringListModel(itmesList, parent);
}